

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRecStop3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  if (iVar1 == -1) {
    iVar1 = Abc_NtkRecIsRunning3();
    if (iVar1 == 0) {
      Abc_Print(-1,"This command works only after calling \"rec_start3\".\n");
      pAbc_local._4_4_ = 0;
    }
    else {
      Abc_NtkRecStop3();
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: rec_stop3 [-h]\n");
    Abc_Print(-2,"\t        cleans the internal storage for AIG subgraphs\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandRecStop3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works only after calling \"rec_start3\".\n" );
        return 0;
    }
    Abc_NtkRecStop3();
    return 0;

usage:
    Abc_Print( -2, "usage: rec_stop3 [-h]\n" );
    Abc_Print( -2, "\t        cleans the internal storage for AIG subgraphs\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}